

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePolicyCommand.cxx
# Opt level: O0

bool __thiscall
cmCMakePolicyCommand::HandleGetMode
          (cmCMakePolicyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  bool bVar1;
  PolicyStatus PVar2;
  size_type sVar3;
  char *id_00;
  ostream *poVar4;
  PolicyID id_01;
  string local_3c8;
  string local_3a8;
  undefined1 local_388 [8];
  ostringstream e_1;
  undefined1 local_208 [4];
  PolicyStatus status;
  ostringstream local_1e8 [8];
  ostringstream e;
  PolicyID local_6c;
  const_reference pvStack_68;
  PolicyID pid;
  string *var;
  string *id;
  allocator local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCMakePolicyCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar3 == 3) {
    var = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](local_20,1);
    pvStack_68 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_20,2);
    id_00 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmPolicies::GetPolicyID(id_00,&local_6c);
    if (bVar1) {
      PVar2 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,local_6c);
      switch(PVar2) {
      case OLD:
        cmMakefile::AddDefinition((this->super_cmCommand).Makefile,pvStack_68,"OLD");
        break;
      case WARN:
        cmMakefile::AddDefinition((this->super_cmCommand).Makefile,pvStack_68,"");
        break;
      case NEW:
        cmMakefile::AddDefinition((this->super_cmCommand).Makefile,pvStack_68,"NEW");
        break;
      case REQUIRED_IF_USED:
      case REQUIRED_ALWAYS:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_388);
        cmPolicies::GetRequiredPolicyError_abi_cxx11_
                  (&local_3a8,(cmPolicies *)(ulong)local_6c,id_01);
        poVar4 = std::operator<<((ostream *)local_388,(string *)&local_3a8);
        poVar4 = std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(poVar4,"The call to cmake_policy(GET ");
        poVar4 = std::operator<<(poVar4,(string *)var);
        poVar4 = std::operator<<(poVar4," ...) at which this ");
        poVar4 = std::operator<<(poVar4,
                                 "error appears requests the policy, and this version of CMake ");
        std::operator<<(poVar4,"requires that the policy be set to NEW before it is checked.");
        std::__cxx11::string::~string((string *)&local_3a8);
        this_00 = (this->super_cmCommand).Makefile;
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_3c8,false);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_388);
      }
      this_local._7_1_ = 1;
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1e8);
      poVar4 = std::operator<<((ostream *)local_1e8,"GET given policy \"");
      poVar4 = std::operator<<(poVar4,(string *)var);
      poVar4 = std::operator<<(poVar4,"\" which is not known to this ");
      std::operator<<(poVar4,"version of CMake.");
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,(string *)local_208);
      std::__cxx11::string::~string((string *)local_208);
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_1e8);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"GET must be given exactly 2 additional arguments.",&local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCMakePolicyCommand::HandleGetMode(std::vector<std::string> const& args)
{
  if(args.size() != 3)
    {
    this->SetError("GET must be given exactly 2 additional arguments.");
    return false;
    }

  // Get arguments.
  std::string const& id = args[1];
  std::string const& var = args[2];

  // Lookup the policy number.
  cmPolicies::PolicyID pid;
  if(!cmPolicies::GetPolicyID(id.c_str(), pid))
    {
    std::ostringstream e;
    e << "GET given policy \"" << id << "\" which is not known to this "
      << "version of CMake.";
    this->SetError(e.str());
    return false;
    }

  // Lookup the policy setting.
  cmPolicies::PolicyStatus status = this->Makefile->GetPolicyStatus(pid);
  switch (status)
    {
    case cmPolicies::OLD:
      // Report that the policy is set to OLD.
      this->Makefile->AddDefinition(var, "OLD");
      break;
    case cmPolicies::WARN:
      // Report that the policy is not set.
      this->Makefile->AddDefinition(var, "");
      break;
    case cmPolicies::NEW:
      // Report that the policy is set to NEW.
      this->Makefile->AddDefinition(var, "NEW");
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      // The policy is required to be set before anything needs it.
      {
      std::ostringstream e;
      e << cmPolicies::GetRequiredPolicyError(pid)
        << "\n"
        << "The call to cmake_policy(GET " << id << " ...) at which this "
        << "error appears requests the policy, and this version of CMake "
        << "requires that the policy be set to NEW before it is checked.";
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      }
    }

  return true;
}